

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this)

{
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  undefined1 local_19;
  cmExportInstallFileGenerator *local_18;
  cmExportInstallFileGenerator *this_local;
  string *glob;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmExportInstallFileGenerator *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_50,&(this->super_cmExportFileGenerator).FileBase);
  cmAlphaNum::cmAlphaNum(&local_80,"-*");
  cmStrCat<std::__cxx11::string>
            (__return_storage_ptr__,&local_50,&local_80,&(this->super_cmExportFileGenerator).FileExt
            );
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetConfigImportFileGlob()
{
  std::string glob = cmStrCat(this->FileBase, "-*", this->FileExt);
  return glob;
}